

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParallelExecutionTests.cpp
# Opt level: O3

void __thiscall
agge::tests::ParallelExecutionTests::CallsInSingleThreadedObjectAreMadeInTheCurrentThread
          (ParallelExecutionTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int *piVar3;
  thread_id tVar4;
  FailedAssertion *pFVar5;
  long lVar6;
  log_container log;
  parallel p;
  thread_capture tc;
  mutex mtx;
  string local_150;
  string local_130;
  LocationInfo local_110;
  int *local_e8;
  long lStack_e0;
  undefined8 local_d8;
  parallel local_d0;
  kernel_function local_b0;
  int **local_a8;
  mutex *local_a0;
  mutex local_94;
  
  parallel::parallel(&local_d0,1);
  local_e8 = (int *)0x0;
  lStack_e0 = 0;
  local_d8 = 0;
  mutex::mutex(&local_94);
  local_b0._vptr_kernel_function = (_func_int **)&PTR_operator___001c2c80;
  local_a8 = &local_e8;
  local_a0 = &local_94;
  parallel::call(&local_d0,&local_b0);
  lVar6 = lStack_e0 - (long)local_e8;
  paVar1 = &local_150.field_2;
  local_150._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_150,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_110,&local_150,0x4b);
  if (lVar6 != 0x10) {
    pFVar5 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Values are not equal!","")
    ;
    ut::FailedAssertion::FailedAssertion(pFVar5,&local_130,&local_110);
    __cxa_throw(pFVar5,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  paVar2 = &local_110.filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_110.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  piVar3 = local_e8;
  local_150._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_150,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_110,&local_150,0x4c);
  if (*piVar3 != 0) {
    pFVar5 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Values are not equal!","")
    ;
    ut::FailedAssertion::FailedAssertion(pFVar5,&local_130,&local_110);
    __cxa_throw(pFVar5,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_110.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  tVar4 = this_thread_id();
  piVar3 = local_e8;
  local_150._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_150,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_110,&local_150,0x4d);
  if (tVar4 != *(thread_id *)(piVar3 + 2)) {
    pFVar5 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Values are not equal!","")
    ;
    ut::FailedAssertion::FailedAssertion(pFVar5,&local_130,&local_110);
    __cxa_throw(pFVar5,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_110.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  parallel::call(&local_d0,&local_b0);
  lVar6 = lStack_e0 - (long)local_e8;
  local_150._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_150,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_110,&local_150,0x53);
  if (lVar6 != 0x20) {
    pFVar5 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Values are not equal!","")
    ;
    ut::FailedAssertion::FailedAssertion(pFVar5,&local_130,&local_110);
    __cxa_throw(pFVar5,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_110.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  piVar3 = local_e8;
  local_150._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_150,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_110,&local_150,0x54);
  if (piVar3[4] == 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.filename._M_dataplus._M_p != paVar2) {
      operator_delete(local_110.filename._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar1) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    tVar4 = this_thread_id();
    piVar3 = local_e8;
    local_150._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_150,
               "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
               ,"");
    ut::LocationInfo::LocationInfo(&local_110,&local_150,0x55);
    if (tVar4 == *(thread_id *)(piVar3 + 6)) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110.filename._M_dataplus._M_p != paVar2) {
        operator_delete(local_110.filename._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != paVar1) {
        operator_delete(local_150._M_dataplus._M_p);
      }
      mutex::~mutex(&local_94);
      if (local_e8 != (int *)0x0) {
        operator_delete(local_e8);
      }
      parallel::~parallel(&local_d0);
      return;
    }
    pFVar5 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Values are not equal!","")
    ;
    ut::FailedAssertion::FailedAssertion(pFVar5,&local_130,&local_110);
    __cxa_throw(pFVar5,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  pFVar5 = (FailedAssertion *)__cxa_allocate_exception(0x38);
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Values are not equal!","");
  ut::FailedAssertion::FailedAssertion(pFVar5,&local_130,&local_110);
  __cxa_throw(pFVar5,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
}

Assistant:

test( CallsInSingleThreadedObjectAreMadeInTheCurrentThread )
			{
				// INIT
				parallel p(1);
				thread_capture::log_container log;
				mutex mtx;
				thread_capture tc(log, mtx);

				// ACT
				p.call(tc);

				// ASSERT
				assert_equal(1u, log.size());
				assert_equal(0u, log[0].first);
				assert_equal(this_thread_id(), log[0].second);

				// ACT
				p.call(tc);

				// ASSERT
				assert_equal(2u, log.size());
				assert_equal(0u, log[1].first);
				assert_equal(this_thread_id(), log[1].second);
			}